

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

aiNode * get_node_for_mesh(uint meshIndex,aiNode *node)

{
  aiNode *paVar1;
  aiNode *ret;
  size_t i_1;
  size_t i;
  aiNode *node_local;
  uint meshIndex_local;
  
  for (i_1 = 0; i_1 < node->mNumMeshes; i_1 = i_1 + 1) {
    if (node->mMeshes[i_1] == meshIndex) {
      return node;
    }
  }
  ret = (aiNode *)0x0;
  while( true ) {
    if ((aiNode *)(ulong)node->mNumChildren <= ret) {
      return (aiNode *)0x0;
    }
    paVar1 = get_node_for_mesh(meshIndex,node->mChildren[(long)ret]);
    if (paVar1 != (aiNode *)0x0) break;
    ret = (aiNode *)((long)&(ret->mName).length + 1);
  }
  return paVar1;
}

Assistant:

aiNode* get_node_for_mesh(unsigned int meshIndex, aiNode* node)
{
    for (size_t i = 0; i < node->mNumMeshes; ++i) {
        if (node->mMeshes[i] == meshIndex) {
            return node;
        }
    }
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        aiNode* ret = get_node_for_mesh(meshIndex, node->mChildren[i]);
        if (ret) { return ret; }
    }
    return nullptr;
}